

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_info.hpp
# Opt level: O3

void __thiscall duckdb::SetDefaultInfo::SetDefaultInfo(SetDefaultInfo *this)

{
  *(undefined2 *)&(this->super_AlterTableInfo).super_AlterInfo.super_ParseInfo.info_type = 0x100;
  (this->super_AlterTableInfo).super_AlterInfo.catalog._M_dataplus._M_p =
       (pointer)&(this->super_AlterTableInfo).super_AlterInfo.catalog.field_2;
  (this->super_AlterTableInfo).super_AlterInfo.catalog._M_string_length = 0;
  (this->super_AlterTableInfo).super_AlterInfo.catalog.field_2._M_local_buf[0] = '\0';
  (this->super_AlterTableInfo).super_AlterInfo.schema._M_dataplus._M_p =
       (pointer)&(this->super_AlterTableInfo).super_AlterInfo.schema.field_2;
  (this->super_AlterTableInfo).super_AlterInfo.schema._M_string_length = 0;
  (this->super_AlterTableInfo).super_AlterInfo.schema.field_2._M_local_buf[0] = '\0';
  (this->super_AlterTableInfo).super_AlterInfo.name._M_dataplus._M_p =
       (pointer)&(this->super_AlterTableInfo).super_AlterInfo.name.field_2;
  (this->super_AlterTableInfo).super_AlterInfo.name._M_string_length = 0;
  (this->super_AlterTableInfo).super_AlterInfo.name.field_2._M_local_buf[0] = '\0';
  (this->super_AlterTableInfo).super_AlterInfo.field_0x71 = 6;
  (this->super_AlterTableInfo).super_AlterInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)&PTR__SetDefaultInfo_0243abd0;
  (this->column_name)._M_dataplus._M_p = (pointer)&(this->column_name).field_2;
  (this->column_name)._M_string_length = 0;
  (this->column_name).field_2._M_local_buf[0] = '\0';
  (this->expression).
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0;
  return;
}

Assistant:

explicit ParseInfo(ParseInfoType info_type) : info_type(info_type) {
	}